

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_format.hpp
# Opt level: O3

void lightconf::config_format::write_vector(scanner *sc,writer *wr,value_vector_type *vec)

{
  double *pdVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer pvVar4;
  pointer ptVar5;
  pointer pcVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  undefined8 uVar10;
  ulong uVar11;
  uint uVar12;
  scanner *this;
  writer *pwVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  value *val;
  pointer pvVar19;
  bool bVar20;
  bool bVar21;
  scanner dummy_scanner;
  undefined1 local_198 [8];
  char *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  vector<lightconf::token,_std::allocator<lightconf::token>_> local_178;
  uint uStack_160;
  undefined4 uStack_15c;
  undefined8 local_158;
  int local_150;
  _Any_data local_148;
  _Manager_type local_138;
  _Invoker_type p_Stack_130;
  int local_128;
  _Any_data local_120;
  _Manager_type local_110 [3];
  scanner *local_f8;
  writer *local_f0;
  string local_e8;
  value local_c8;
  
  pvVar4 = (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar18 = 3;
  for (pvVar19 = (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
                 _M_impl.super__Vector_impl_data._M_start; pvVar19 != pvVar4; pvVar19 = pvVar19 + 1)
  {
    iVar14 = value_length(pvVar19,0x78);
    iVar18 = iVar18 + iVar14 + 2;
  }
  iVar14 = wr->wrap_length;
  local_198 = (undefined1  [8])&local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"[ ","");
  std::__cxx11::string::_M_append((char *)wr,(ulong)local_198);
  wr->col = wr->col + (int)local_190;
  if (local_198 != (undefined1  [8])&local_188) {
    operator_delete((void *)local_198);
  }
  writer::indent(wr);
  if (iVar14 < iVar18) {
    writer::newline(wr);
  }
  local_f0 = wr;
  scanner::expect(sc,'[',false);
  uVar17 = 0;
  local_f8 = sc;
  do {
    uVar16 = sc->cur_token_;
    ptVar5 = (sc->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar15 = (long)(sc->tokens_).
                   super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)ptVar5 >> 6;
    do {
      uVar11 = (ulong)uVar16;
      if (uVar15 <= uVar11) break;
      uVar16 = uVar16 + 1;
    } while (ptVar5[uVar11].type - whitespace_token < 2);
    uVar16 = (uint)uVar17;
    if (uVar15 != uVar11) {
      local_198._0_4_ = ptVar5[uVar11].type;
      pcVar6 = ptVar5[uVar11].string_value._M_dataplus._M_p;
      local_190 = local_188._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,pcVar6,pcVar6 + ptVar5[uVar11].string_value._M_string_length);
      uVar2 = ptVar5[uVar11].line;
      uVar7 = ptVar5[uVar11].col;
      dVar9 = ptVar5[uVar11].number_value;
      uVar10 = (&ptVar5[uVar11].number_value)[1];
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = SUB84(dVar9,0);
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)dVar9 >> 0x20);
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = (uint)uVar10;
      uVar12 = (uint)local_178.
                     super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (int)((ulong)uVar10 >> 0x20);
      bVar20 = local_198._0_4_ == 4;
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = (char)uVar10;
      bVar21 = (char)local_178.
                     super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage == ']';
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = uVar12;
      uStack_160 = uVar2;
      uStack_15c = uVar7;
      if (local_190 != local_188._M_local_buf + 8) {
        operator_delete(local_190);
      }
      pwVar13 = local_f0;
      this = local_f8;
      sc = local_f8;
      if (bVar21 && bVar20) break;
    }
    pwVar13 = local_f0;
    pvVar19 = (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>)._M_impl
              .super__Vector_impl_data._M_start;
    uVar15 = ((long)(vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pvVar19 >> 3) *
             -0x79435e50d79435e5;
    if (uVar15 < uVar17 || uVar15 - uVar17 == 0) {
      read_value(&local_c8,sc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8.group_value_.order_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
                   *)&local_c8.group_value_);
      std::vector<lightconf::value,_std::allocator<lightconf::value>_>::~vector
                (&local_c8.vector_value_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.string_value_._M_dataplus._M_p != &local_c8.string_value_.field_2) {
        operator_delete(local_c8.string_value_._M_dataplus._M_p);
      }
    }
    else {
      write_value(sc,local_f0,pvVar19 + uVar17);
      uVar17 = (ulong)(uVar16 + 1);
    }
    uVar16 = sc->cur_token_;
    ptVar5 = (sc->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar15 = (long)(sc->tokens_).
                   super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)ptVar5 >> 6;
    do {
      uVar11 = (ulong)uVar16;
      if (uVar15 <= uVar11) break;
      uVar16 = uVar16 + 1;
    } while (ptVar5[uVar11].type - whitespace_token < 2);
    if (uVar15 == uVar11) {
      local_198._0_4_ = 7;
      local_190 = local_188._M_local_buf + 8;
      local_188._M_allocated_capacity = 0;
      local_188._M_local_buf[8] = '\0';
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffff00;
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uStack_160 = 0;
      uStack_15c._0_1_ = false;
      uStack_15c._1_3_ = 0;
LAB_001151cc:
      if (local_190 != local_188._M_local_buf + 8) {
        operator_delete(local_190);
      }
LAB_001152b3:
      if (iVar14 < iVar18) {
        writer::newline(pwVar13);
      }
      else {
        local_198 = (undefined1  [8])&local_188;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_198,", ","");
        std::__cxx11::string::_M_append((char *)pwVar13,(ulong)local_198);
LAB_001152fb:
        pwVar13->col = pwVar13->col + (int)local_190;
        if (local_198 != (undefined1  [8])&local_188) {
          operator_delete((void *)local_198);
        }
      }
    }
    else {
      local_198._0_4_ = ptVar5[uVar11].type;
      pcVar6 = ptVar5[uVar11].string_value._M_dataplus._M_p;
      local_190 = local_188._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,pcVar6,pcVar6 + ptVar5[uVar11].string_value._M_string_length);
      uVar3 = ptVar5[uVar11].line;
      uVar8 = ptVar5[uVar11].col;
      pdVar1 = &ptVar5[uVar11].number_value;
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)pdVar1;
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = *(undefined4 *)((long)pdVar1 + 4);
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = *(uint *)(pdVar1 + 1);
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = *(int *)((long)pdVar1 + 0xc);
      uStack_160 = uVar3;
      uStack_15c = uVar8;
      if ((local_198._0_4_ != 4) ||
         ((char)local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage != ']')) goto LAB_001151cc;
      pvVar19 = (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      pvVar4 = (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (local_190 != local_188._M_local_buf + 8) {
        operator_delete(local_190);
      }
      if (((long)pvVar19 - (long)pvVar4 >> 3) * -0x79435e50d79435e5 - uVar17 != 0)
      goto LAB_001152b3;
      if (iVar18 <= iVar14) {
        local_198 = (undefined1  [8])&local_188;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_198," ","");
        std::__cxx11::string::_M_append((char *)pwVar13,(ulong)local_198);
        goto LAB_001152fb;
      }
    }
    scanner::expect(sc,',',true);
  } while( true );
  uVar15 = ((long)(vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5;
  if (uVar17 <= uVar15 && uVar15 - uVar17 != 0) {
    do {
      uVar16 = uVar16 + 1;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"0","");
      local_198 = (undefined1  [8])&local_188;
      local_190 = (char *)0x0;
      local_188._M_allocated_capacity = local_188._M_allocated_capacity & 0xffffffffffffff00;
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uStack_160 = 0;
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      local_178.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      uStack_15c._0_1_ = true;
      local_158._0_4_ = 0;
      local_158._4_4_ = 1;
      local_150 = 1;
      local_138 = (_Manager_type)0x0;
      p_Stack_130 = (_Invoker_type)0x0;
      local_148._M_unused._M_object = (void *)0x0;
      local_148._8_8_ = 0;
      local_128 = 0;
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_120,
                 (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)default_scanner_params);
      local_110[2]._0_4_ = default_scanner_params._32_4_;
      scanner::scan((scanner *)local_198,&local_e8,(scanner_params *)&local_120);
      if (local_110[0] != (_Manager_type)0x0) {
        (*local_110[0])(&local_120,&local_120,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      write_value((scanner *)local_198,pwVar13,
                  (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
                  _M_impl.super__Vector_impl_data._M_start + uVar17);
      if (uVar17 < ((long)(vec->
                          super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(vec->
                          super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5 - 1U)
      {
        if (iVar14 < iVar18) {
          writer::newline(pwVar13);
        }
        else {
          local_120._M_unused._M_object = local_110;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,", ","");
          std::__cxx11::string::_M_append((char *)pwVar13,local_120._M_unused._M_member_pointer);
LAB_00115547:
          pwVar13->col = pwVar13->col + local_120._8_4_;
          if ((_Manager_type *)local_120._M_unused._0_8_ != local_110) {
            operator_delete(local_120._M_unused._M_object);
          }
        }
      }
      else if (iVar18 <= iVar14) {
        local_120._M_unused._M_object = local_110;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_120," ","");
        std::__cxx11::string::_M_append((char *)pwVar13,local_120._M_unused._M_member_pointer);
        goto LAB_00115547;
      }
      if (local_138 != (_Manager_type)0x0) {
        (*local_138)(&local_148,&local_148,__destroy_functor);
      }
      std::vector<lightconf::token,_std::allocator<lightconf::token>_>::~vector(&local_178);
      if (local_198 != (undefined1  [8])&local_188) {
        operator_delete((void *)local_198);
      }
      uVar17 = (ulong)uVar16;
      uVar15 = ((long)(vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>)
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5;
    } while (uVar17 <= uVar15 && uVar15 - uVar17 != 0);
  }
  std::deque<int,_std::allocator<int>_>::pop_back(&(pwVar13->tabstops).c);
  if (iVar14 < iVar18) {
    writer::newline(pwVar13);
  }
  scanner::expect(this,']',false);
  local_198 = (undefined1  [8])&local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"]","");
  std::__cxx11::string::_M_append((char *)pwVar13,(ulong)local_198);
  pwVar13->col = pwVar13->col + (int)local_190;
  if (local_198 != (undefined1  [8])&local_188) {
    operator_delete((void *)local_198);
  }
  return;
}

Assistant:

inline void write_vector(scanner& sc, writer& wr, const value_vector_type& vec) {
    bool wrap = vector_length(vec) > wr.wrap_length;

    wr.append("[ ");
    wr.indent();
    if (wrap) {
        wr.newline();
    }
    sc.expect('[');

    unsigned int vals_read = 0;
    while (!sc.peek_token().is_char(']')) {
        if (vals_read < vec.size()) {
            write_value(sc, wr, vec[vals_read]);
            vals_read++;
        } else {
            read_value(sc);
        }

        bool terminate = sc.peek_token().is_char(']') && vals_read == vec.size();
        if (!terminate) {
            if (wrap) {
                wr.newline();
            } else {
                wr.append(", ");
            }
        } else if (!wrap) {
            wr.append(" ");
        }
        sc.expect(',', true);
    }

    for (unsigned int i = vals_read; i < vec.size(); i++) {
        scanner dummy_scanner = make_scanner("0");
        write_value(dummy_scanner, wr, vec[i]);
        if (i < vec.size() - 1) {
            if (wrap) {
                wr.newline();
            } else {
                wr.append(", ");
            }
        } else if (!wrap) {
            wr.append(" ");
        }
    }

    wr.unindent();
    if (wrap) {
        wr.newline();
    }

    sc.expect(']');
    wr.append("]");
}